

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int local_50;
  int c;
  int length;
  int quote;
  xmlChar *start;
  xmlSBuf buf;
  uint maxLength;
  xmlChar **orig_local;
  xmlParserCtxtPtr ctxt_local;
  
  buf.code = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    buf.code = 1000000000;
  }
  xmlSBufInit((xmlSBuf *)&start,buf.code);
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xVar1 = *ctxt->input->cur;
  if ((xVar1 == '\"') || (xVar1 == '\'')) {
    ctxt->input->cur = ctxt->input->cur + 1;
    local_50 = 0;
    while (ctxt->disableSAX < 2) {
      if (ctxt->input->end <= ctxt->input->cur) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
        break;
      }
      xVar2 = *ctxt->input->cur;
      if (xVar2 == '\0') {
        xmlFatalErrMsg(ctxt,XML_ERR_INVALID_CHAR,"invalid character in entity value\n");
        break;
      }
      if (xVar2 == xVar1) {
        pxVar3 = ctxt->input->cur + -(long)local_50;
        if (orig != (xmlChar **)0x0) {
          pxVar4 = xmlStrndup(pxVar3,local_50);
          *orig = pxVar4;
          if (*orig == (xmlChar *)0x0) {
            xmlErrMemory(ctxt);
          }
        }
        xmlExpandPEsInEntityValue(ctxt,(xmlSBuf *)&start,pxVar3,local_50,ctxt->inputNr);
        if (*ctxt->input->cur == '\n') {
          ctxt->input->line = ctxt->input->line + 1;
          ctxt->input->col = 1;
        }
        else {
          ctxt->input->col = ctxt->input->col + 1;
        }
        ctxt->input->cur = ctxt->input->cur + 1;
        pxVar3 = xmlSBufFinish((xmlSBuf *)&start,(int *)0x0,ctxt,"entity length too long");
        return pxVar3;
      }
      if (*ctxt->input->cur == '\n') {
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
      }
      else {
        ctxt->input->col = ctxt->input->col + 1;
      }
      ctxt->input->cur = ctxt->input->cur + 1;
      local_50 = local_50 + 1;
      if ((((long)ctxt->input->end - (long)ctxt->input->cur < 10) &&
          ((ctxt->input->flags & 0x40U) == 0)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
    }
    xmlSBufCleanup((xmlSBuf *)&start,ctxt,"entity length too long");
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    const xmlChar *start;
    int quote, length;

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    CUR_PTR++;

    length = 0;

    /*
     * Copy raw content of the entity into a buffer
     */
    while (1) {
        int c;

        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
            goto error;
        }

        c = CUR;

        if (c == 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                    "invalid character in entity value\n");
            goto error;
        }
        if (c == quote)
            break;
        NEXTL(1);
        length += 1;

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;
    }

    start = CUR_PTR - length;

    if (orig != NULL) {
        *orig = xmlStrndup(start, length);
        if (*orig == NULL)
            xmlErrMemory(ctxt);
    }

    xmlExpandPEsInEntityValue(ctxt, &buf, start, length, ctxt->inputNr);

    NEXTL(1);

    return(xmlSBufFinish(&buf, NULL, ctxt, "entity length too long"));

error:
    xmlSBufCleanup(&buf, ctxt, "entity length too long");
    return(NULL);
}